

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O0

void __thiscall
LibGens::Ym2612Private::T_Update_Chan_LFO<4>
          (Ym2612Private *this,channel_t *CH,int32_t *bufL,int32_t *bufR,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int en3;
  int en2;
  int en1;
  int en0;
  int in3;
  int in2;
  int in1;
  int in0;
  int i;
  int freq_LFO;
  int env_LFO;
  int not_end;
  int length_local;
  int32_t *bufR_local;
  int32_t *bufL_local;
  channel_t *CH_local;
  Ym2612Private *this_local;
  
  if (CH->_SLOT[2].Ecnt != 0x20000000 || CH->_SLOT[3].Ecnt != 0x20000000) {
    for (in1 = 0; in1 < length; in1 = in1 + 1) {
      iVar1 = CH->_SLOT[0].Fcnt;
      iVar2 = CH->_SLOT[2].Fcnt;
      iVar3 = CH->_SLOT[1].Fcnt;
      iVar4 = CH->_SLOT[3].Fcnt;
      iVar19 = CH->FMS * this->LFO_FREQ_UP[in1] >> 9;
      if (iVar19 == 0) {
        CH->_SLOT[0].Fcnt = CH->_SLOT[0].Finc + CH->_SLOT[0].Fcnt;
        CH->_SLOT[2].Fcnt = CH->_SLOT[2].Finc + CH->_SLOT[2].Fcnt;
        CH->_SLOT[1].Fcnt = CH->_SLOT[1].Finc + CH->_SLOT[1].Fcnt;
        CH->_SLOT[3].Fcnt = CH->_SLOT[3].Finc + CH->_SLOT[3].Fcnt;
      }
      else {
        CH->_SLOT[0].Fcnt =
             CH->_SLOT[0].Finc + (CH->_SLOT[0].Finc * iVar19 >> 9) + CH->_SLOT[0].Fcnt;
        CH->_SLOT[2].Fcnt =
             CH->_SLOT[2].Finc + (CH->_SLOT[2].Finc * iVar19 >> 9) + CH->_SLOT[2].Fcnt;
        CH->_SLOT[1].Fcnt =
             CH->_SLOT[1].Finc + (CH->_SLOT[1].Finc * iVar19 >> 9) + CH->_SLOT[1].Fcnt;
        CH->_SLOT[3].Fcnt =
             CH->_SLOT[3].Finc + (CH->_SLOT[3].Finc * iVar19 >> 9) + CH->_SLOT[3].Fcnt;
      }
      iVar19 = this->LFO_ENV_UP[in1];
      iVar5 = *(int *)(ENV_TAB + (long)(CH->_SLOT[0].Ecnt >> 0x10) * 4);
      iVar6 = CH->_SLOT[0].TLL;
      iVar7 = CH->_SLOT[0].AMS;
      iVar8 = *(int *)(ENV_TAB + (long)(CH->_SLOT[2].Ecnt >> 0x10) * 4);
      iVar9 = CH->_SLOT[2].TLL;
      iVar10 = CH->_SLOT[2].AMS;
      iVar11 = *(int *)(ENV_TAB + (long)(CH->_SLOT[1].Ecnt >> 0x10) * 4);
      iVar12 = CH->_SLOT[1].TLL;
      iVar13 = CH->_SLOT[1].AMS;
      iVar14 = *(int *)(ENV_TAB + (long)(CH->_SLOT[3].Ecnt >> 0x10) * 4);
      iVar15 = CH->_SLOT[3].TLL;
      iVar16 = CH->_SLOT[3].AMS;
      iVar20 = CH->_SLOT[0].Einc + CH->_SLOT[0].Ecnt;
      CH->_SLOT[0].Ecnt = iVar20;
      if (CH->_SLOT[0].Ecmp <= iVar20) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[0].Ecurp * 8))(CH->_SLOT);
      }
      iVar20 = CH->_SLOT[2].Einc + CH->_SLOT[2].Ecnt;
      CH->_SLOT[2].Ecnt = iVar20;
      if (CH->_SLOT[2].Ecmp <= iVar20) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[2].Ecurp * 8))(CH->_SLOT + 2);
      }
      iVar20 = CH->_SLOT[1].Einc + CH->_SLOT[1].Ecnt;
      CH->_SLOT[1].Ecnt = iVar20;
      if (CH->_SLOT[1].Ecmp <= iVar20) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[1].Ecurp * 8))(CH->_SLOT + 1);
      }
      iVar20 = CH->_SLOT[3].Einc + CH->_SLOT[3].Ecnt;
      CH->_SLOT[3].Ecnt = iVar20;
      if (CH->_SLOT[3].Ecmp <= iVar20) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[3].Ecurp * 8))(CH->_SLOT + 3);
      }
      iVar20 = CH->S0_OUT[0];
      iVar17 = CH->S0_OUT[1];
      iVar18 = CH->FB;
      CH->S0_OUT[1] = CH->S0_OUT[0];
      CH->S0_OUT[0] =
           *(int *)(*(long *)(SIN_TAB +
                             (long)(int)((iVar20 + iVar17 >> ((byte)iVar18 & 0x1f)) + iVar1 >> 0xe &
                                        0xfff) * 8) +
                   (long)(iVar5 + iVar6 + (iVar19 >> ((byte)iVar7 & 0x1f))) * 4);
      CH->OUTd = *(int *)(*(long *)(SIN_TAB +
                                   (long)(int)(*(int *)(*(long *)(SIN_TAB +
                                                                 (long)(int)(iVar3 >> 0xe & 0xfff) *
                                                                 8) +
                                                       (long)(iVar11 + iVar12 +
                                                             (iVar19 >> ((byte)iVar13 & 0x1f))) * 4)
                                               + iVar4 >> 0xe & 0xfff) * 8) +
                         (long)(iVar14 + iVar15 + (iVar19 >> ((byte)iVar16 & 0x1f))) * 4) +
                 *(int *)(*(long *)(SIN_TAB + (long)(int)(CH->S0_OUT[0] + iVar2 >> 0xe & 0xfff) * 8)
                         + (long)(iVar8 + iVar9 + (iVar19 >> ((byte)iVar10 & 0x1f))) * 4) >> 0xe;
      if (LIMIT_CH_OUT < CH->OUTd) {
        CH->OUTd = LIMIT_CH_OUT;
      }
      else if (CH->OUTd < -LIMIT_CH_OUT) {
        CH->OUTd = -LIMIT_CH_OUT;
      }
      bufL[in1] = ((CH->OUTd * CH->PANVolumeL) / 0xffff & CH->LEFT) + bufL[in1];
      bufR[in1] = ((CH->OUTd * CH->PANVolumeR) / 0xffff & CH->RIGHT) + bufR[in1];
    }
  }
  return;
}

Assistant:

inline void Ym2612Private::T_Update_Chan_LFO(channel_t *CH, int32_t *bufL, int32_t *bufR, int length)
{
	// Check if the channel has reached the end of the update.
	{
		int not_end = (CH->_SLOT[S3].Ecnt - ENV_END);

		// Special cases.
		// Copied from Game_Music_Emu v0.5.2.
		if (algo == 7)
			not_end |= (CH->_SLOT[S0].Ecnt - ENV_END);
		if (algo >= 5)
			not_end |= (CH->_SLOT[S2].Ecnt - ENV_END);
		if (algo >= 4)
			not_end |= (CH->_SLOT[S1].Ecnt - ENV_END);

		if (not_end == 0)
			return;
	}

	int env_LFO, freq_LFO;

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"Algo %d LFO len = %d", algo, length);

	for (int i = 0; i < length; i++) {
		int in0, in1, in2, in3;		// current phase calculation
		int en0, en1, en2, en3;		// current envelope calculation

		GET_CURRENT_PHASE();
		UPDATE_PHASE_LFO();
		GET_CURRENT_ENV_LFO();
		UPDATE_ENV();

		assert(algo >= 0 && algo <= 7);
		switch (algo) {
			case 0:
				DO_ALGO_0();
				break;
			case 1:
				DO_ALGO_1();
				break;
			case 2:
				DO_ALGO_2();
				break;
			case 3:
				DO_ALGO_3();
				break;
			case 4:
				DO_ALGO_4();
				break;
			case 5:
				DO_ALGO_5();
				break;
			case 6:
				DO_ALGO_6();
				break;
			case 7:
				DO_ALGO_7();
				break;
			default:
				break;
		}

		DO_OUTPUT();
	}
}